

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

void tdefl_optimize_huffman_table
               (tdefl_compressor *d,int table_num,int table_len,int code_size_limit,int static_table
               )

{
  byte bVar1;
  mz_uint16 mVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [64];
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ushort *puVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  ushort *puVar19;
  int iVar20;
  ushort *puVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  uint *__s;
  ushort uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  int num_codes [33];
  mz_uint next_code [33];
  tdefl_sym_freq syms0 [288];
  tdefl_sym_freq syms1 [288];
  undefined1 auStack_1604 [20];
  undefined8 uStack_15f0;
  int local_15e4;
  long local_15e0;
  long local_15d8;
  undefined8 local_15d0;
  undefined1 local_15c8 [64];
  undefined1 local_1588 [64];
  undefined4 local_1548;
  uint local_1538 [256];
  uint local_1138 [256];
  ushort local_d38 [576];
  uint auStack_8b8 [256];
  ushort local_4b8 [580];
  
  uVar13 = (ulong)(uint)code_size_limit;
  local_15c8 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_1588 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_1548 = 0;
  local_15d0 = (ulong)(uint)table_num;
  uVar26 = (ulong)(uint)table_len;
  if (static_table == 0) {
    local_15d8 = local_15d0 * 9;
    local_15e0 = local_15d0 * 0x240;
    if (table_len < 1) {
      uVar18 = 0;
    }
    else {
      uVar9 = 0;
      uVar18 = 0;
      do {
        mVar2 = d->m_huff_count[local_15d0][uVar9];
        if (mVar2 != 0) {
          lVar12 = (long)(int)uVar18;
          *(mz_uint16 *)(auStack_8b8 + lVar12 + -0x120) = mVar2;
          uVar18 = uVar18 + 1;
          *(short *)((long)auStack_8b8 + lVar12 * 4 + -0x47e) = (short)uVar9;
        }
        uVar9 = uVar9 + 1;
      } while (uVar26 != uVar9);
    }
    __s = local_1538;
    uStack_15f0 = 0x117b40;
    local_15e4 = table_len;
    memset(__s,0,0x800);
    uVar9 = (ulong)uVar18;
    if (uVar18 != 0) {
      uVar10 = 0;
      do {
        uVar14 = auStack_8b8[uVar10 - 0x120];
        local_1538[(byte)(ushort)uVar14] = local_1538[(byte)(ushort)uVar14] + 1;
        local_1138[(ushort)((ushort)uVar14 >> 8)] = local_1138[(ushort)((ushort)uVar14 >> 8)] + 1;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    lVar12 = 2;
    bVar3 = local_1138[0] == uVar18;
    do {
      bVar16 = bVar3;
      lVar25 = lVar12;
      uVar14 = 0;
      lVar12 = 1;
      bVar3 = false;
    } while (bVar16);
    lVar12 = 0;
    puVar19 = local_d38;
    puVar15 = local_4b8;
    do {
      puVar21 = puVar15;
      puVar15 = puVar19;
      lVar22 = 0;
      uVar23 = 0;
      do {
        auStack_8b8[lVar22] = uVar23;
        uVar23 = uVar23 + __s[lVar22];
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x100);
      if (uVar18 != 0) {
        uVar10 = 0;
        do {
          uVar24 = puVar15[uVar10 * 2] >> (uVar14 & 0x1f) & 0xff;
          uVar23 = auStack_8b8[uVar24];
          auStack_8b8[uVar24] = uVar23 + 1;
          *(undefined4 *)(puVar21 + (ulong)uVar23 * 2) = *(undefined4 *)(puVar15 + uVar10 * 2);
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      lVar12 = lVar12 + 1;
      uVar14 = uVar14 + 8;
      __s = __s + 0x100;
      puVar19 = puVar21;
    } while (lVar12 != lVar25);
    if (uVar18 != 0) {
      if (uVar18 == 1) {
        *puVar21 = 1;
      }
      else {
        *puVar21 = *puVar21 + puVar21[2];
        uVar14 = uVar18 - 1;
        if (2 < (int)uVar18) {
          iVar17 = 0;
          iVar8 = 2;
          uVar10 = 1;
          do {
            lVar12 = (long)iVar17;
            if ((iVar8 < (int)uVar18) &&
               (lVar25 = (long)iVar8, puVar21[lVar25 * 2] <= puVar21[lVar12 * 2])) {
              iVar8 = iVar8 + 1;
              puVar21[uVar10 * 2] = puVar21[lVar25 * 2];
            }
            else {
              puVar21[uVar10 * 2] = puVar21[lVar12 * 2];
              iVar17 = iVar17 + 1;
              puVar21[lVar12 * 2] = (ushort)uVar10;
            }
            lVar12 = (long)iVar17;
            if ((iVar8 < (int)uVar18) &&
               ((lVar25 = (long)iVar8, (long)uVar10 <= lVar12 ||
                (puVar21[lVar25 * 2] <= puVar21[lVar12 * 2])))) {
              iVar8 = iVar8 + 1;
              puVar21[uVar10 * 2] = puVar21[uVar10 * 2] + puVar21[lVar25 * 2];
            }
            else {
              puVar21[uVar10 * 2] = puVar21[uVar10 * 2] + puVar21[lVar12 * 2];
              iVar17 = iVar17 + 1;
              puVar21[lVar12 * 2] = (ushort)uVar10;
            }
            uVar10 = uVar10 + 1;
          } while (uVar14 != uVar10);
        }
        puVar21[(long)(int)uVar18 * 2 + -4] = 0;
        if (2 < (int)uVar18) {
          lVar12 = (ulong)(uVar18 - 3) + 1;
          do {
            puVar21[lVar12 * 2 + -2] = puVar21[(ulong)puVar21[lVar12 * 2 + -2] * 2] + 1;
            lVar25 = lVar12 + -1;
            bVar3 = 0 < lVar12;
            lVar12 = lVar25;
          } while (lVar25 != 0 && bVar3);
        }
        uVar10 = (ulong)(uVar18 - 2);
        iVar8 = 1;
        uVar23 = 0;
        do {
          if ((int)uVar10 < 0) {
            iVar17 = 0;
          }
          else {
            iVar20 = (int)uVar10 + 1;
            iVar17 = 0;
            do {
              if (uVar23 != puVar21[uVar10 * 2]) goto LAB_00117d51;
              iVar17 = iVar17 + 1;
              uVar10 = (ulong)((int)uVar10 - 1);
            } while (iVar20 != iVar17);
            uVar10 = 0xffffffff;
            iVar17 = iVar20;
          }
LAB_00117d51:
          if (iVar17 < iVar8) {
            puVar19 = puVar21 + (long)(int)uVar14 * 2;
            uVar14 = (uVar14 + iVar17) - iVar8;
            do {
              *puVar19 = (ushort)uVar23;
              iVar8 = iVar8 + -1;
              puVar19 = puVar19 + -2;
            } while (iVar17 < iVar8);
          }
          iVar8 = iVar17 * 2;
          uVar23 = uVar23 + 1;
        } while (iVar17 != 0);
      }
    }
    if (0 < (int)uVar18) {
      uVar10 = 0;
      do {
        *(int *)(local_15c8 + (ulong)puVar21[uVar10 * 2] * 4) =
             *(int *)(local_15c8 + (ulong)puVar21[uVar10 * 2] * 4) + 1;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    if (1 < (int)uVar18) {
      if (code_size_limit < 0x20) {
        iVar8 = *(int *)(local_15c8 + (ulong)(uint)code_size_limit * 4);
        lVar12 = (long)code_size_limit;
        do {
          iVar8 = iVar8 + *(int *)(local_15c8 + lVar12 * 4 + 4);
          lVar12 = lVar12 + 1;
          *(int *)(local_15c8 + (ulong)(uint)code_size_limit * 4) = iVar8;
        } while (lVar12 != 0x20);
      }
      if (code_size_limit < 1) {
        uVar9 = 0;
      }
      else {
        auVar29 = vpbroadcastd_avx512f();
        auVar30 = vpaddd_avx512f(auVar29,_DAT_0015f780);
        pauVar11 = (undefined1 (*) [64])(auStack_1604 + uVar13 * 4);
        auVar31 = vpbroadcastq_avx512f();
        auVar37 = ZEXT1664((undefined1  [16])0x0);
        uVar9 = 0;
        auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar34 = vpbroadcastd_avx512f(ZEXT416(0xfffffff0));
        do {
          auVar35 = vpbroadcastq_avx512f();
          auVar36 = vporq_avx512f(auVar35,auVar32);
          auVar35 = vporq_avx512f(auVar35,auVar33);
          uVar6 = vpcmpuq_avx512f(auVar35,auVar31,2);
          uVar7 = vpcmpuq_avx512f(auVar36,auVar31,2);
          bVar1 = (byte)uVar7;
          uVar27 = CONCAT11(bVar1,(byte)uVar6);
          auVar35 = vpmovm2d_avx512dq((ulong)uVar27);
          auVar35 = vpshufd_avx512f(auVar35,0x1b);
          auVar35 = vshufi64x2_avx512f(auVar35,auVar35,0x1b);
          uVar10 = vpmovd2m_avx512dq(auVar35);
          auVar35 = vmovdqu32_avx512f(*pauVar11);
          auVar36._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar35._4_4_;
          auVar36._0_4_ = (uint)((byte)uVar10 & 1) * auVar35._0_4_;
          auVar36._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar35._8_4_;
          auVar36._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar35._12_4_;
          auVar36._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar35._16_4_;
          auVar36._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar35._20_4_;
          auVar36._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar35._24_4_;
          auVar36._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar35._28_4_;
          auVar36._32_4_ = (uint)((byte)(uVar10 >> 8) & 1) * auVar35._32_4_;
          auVar36._36_4_ = (uint)((byte)(uVar10 >> 9) & 1) * auVar35._36_4_;
          auVar36._40_4_ = (uint)((byte)(uVar10 >> 10) & 1) * auVar35._40_4_;
          auVar36._44_4_ = (uint)((byte)(uVar10 >> 0xb) & 1) * auVar35._44_4_;
          auVar36._48_4_ = (uint)((byte)(uVar10 >> 0xc) & 1) * auVar35._48_4_;
          auVar36._52_4_ = (uint)((byte)(uVar10 >> 0xd) & 1) * auVar35._52_4_;
          auVar36._56_4_ = (uint)((byte)(uVar10 >> 0xe) & 1) * auVar35._56_4_;
          auVar36._60_4_ = (uint)((byte)(uVar10 >> 0xf) & 1) * auVar35._60_4_;
          auVar35 = vpshufd_avx512f(auVar36,0x1b);
          auVar35 = vshufi64x2_avx512f(auVar35,auVar35,0x1b);
          auVar36 = vpsubd_avx512f(auVar29,auVar30);
          auVar35 = vpsllvd_avx512f(auVar35,auVar36);
          auVar36 = vmovdqa64_avx512f(auVar37);
          auVar37 = vpaddd_avx512f(auVar35,auVar37);
          uVar9 = uVar9 + 0x10;
          auVar30 = vpaddd_avx512f(auVar30,auVar34);
          pauVar11 = pauVar11 + -1;
        } while ((code_size_limit + 0xfU & 0xfffffff0) != uVar9);
        auVar29 = vmovdqa32_avx512f(auVar37);
        bVar3 = (bool)((byte)uVar6 & 1);
        auVar30._0_4_ = (uint)bVar3 * auVar29._0_4_ | (uint)!bVar3 * auVar36._0_4_;
        bVar3 = (bool)((byte)(uVar27 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar3 * auVar29._4_4_ | (uint)!bVar3 * auVar36._4_4_;
        bVar3 = (bool)((byte)(uVar27 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * auVar36._8_4_;
        bVar3 = (bool)((byte)(uVar27 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar3 * auVar29._12_4_ | (uint)!bVar3 * auVar36._12_4_;
        bVar3 = (bool)((byte)(uVar27 >> 4) & 1);
        auVar30._16_4_ = (uint)bVar3 * auVar29._16_4_ | (uint)!bVar3 * auVar36._16_4_;
        bVar3 = (bool)((byte)(uVar27 >> 5) & 1);
        auVar30._20_4_ = (uint)bVar3 * auVar29._20_4_ | (uint)!bVar3 * auVar36._20_4_;
        bVar3 = (bool)((byte)(uVar27 >> 6) & 1);
        auVar30._24_4_ = (uint)bVar3 * auVar29._24_4_ | (uint)!bVar3 * auVar36._24_4_;
        bVar3 = (bool)((byte)(uVar27 >> 7) & 1);
        auVar30._28_4_ = (uint)bVar3 * auVar29._28_4_ | (uint)!bVar3 * auVar36._28_4_;
        auVar30._32_4_ =
             (uint)(bVar1 & 1) * auVar29._32_4_ | (uint)!(bool)(bVar1 & 1) * auVar36._32_4_;
        bVar3 = (bool)(bVar1 >> 1 & 1);
        auVar30._36_4_ = (uint)bVar3 * auVar29._36_4_ | (uint)!bVar3 * auVar36._36_4_;
        bVar3 = (bool)(bVar1 >> 2 & 1);
        auVar30._40_4_ = (uint)bVar3 * auVar29._40_4_ | (uint)!bVar3 * auVar36._40_4_;
        bVar3 = (bool)(bVar1 >> 3 & 1);
        auVar30._44_4_ = (uint)bVar3 * auVar29._44_4_ | (uint)!bVar3 * auVar36._44_4_;
        bVar3 = (bool)(bVar1 >> 4 & 1);
        auVar30._48_4_ = (uint)bVar3 * auVar29._48_4_ | (uint)!bVar3 * auVar36._48_4_;
        bVar3 = (bool)(bVar1 >> 5 & 1);
        auVar30._52_4_ = (uint)bVar3 * auVar29._52_4_ | (uint)!bVar3 * auVar36._52_4_;
        bVar3 = (bool)(bVar1 >> 6 & 1);
        auVar30._56_4_ = (uint)bVar3 * auVar29._56_4_ | (uint)!bVar3 * auVar36._56_4_;
        auVar30._60_4_ =
             (uint)(bVar1 >> 7) * auVar29._60_4_ | (uint)!(bool)(bVar1 >> 7) * auVar36._60_4_;
        auVar28 = vextracti64x4_avx512f(auVar30,1);
        auVar29 = vpaddd_avx512f(auVar30,ZEXT3264(auVar28));
        auVar4 = vpaddd_avx(auVar29._0_16_,auVar29._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpaddd_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpaddd_avx(auVar4,auVar5);
        uVar9 = (ulong)auVar4._0_4_;
      }
      for (; 1L << (uVar13 & 0x3f) != uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
        *(int *)(local_15c8 + uVar13 * 4) = *(int *)(local_15c8 + uVar13 * 4) + -1;
        uVar10 = uVar13;
        do {
          if ((int)uVar10 < 2) goto LAB_00117f08;
          lVar12 = uVar10 * 4;
          uVar10 = uVar10 - 1;
        } while (*(int *)(local_15c8 + lVar12 + -4) == 0);
        *(int *)(local_15c8 + uVar10 * 4) = *(int *)(local_15c8 + lVar12 + -4) + -1;
        *(int *)(local_15c8 + (ulong)((int)uVar10 + 1U & 0x7fffffff) * 4) =
             *(int *)(local_15c8 + (ulong)((int)uVar10 + 1U & 0x7fffffff) * 4) + 2;
LAB_00117f08:
      }
    }
    lVar12 = local_15d8 * 0x20;
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = vmovdqu64_avx512f(auVar30);
    *(undefined1 (*) [64])(d->m_huff_code_sizes[0] + lVar12 + 0xe0) = auVar29;
    auVar29 = vmovdqu64_avx512f(auVar30);
    *(undefined1 (*) [64])(d->m_huff_code_sizes[0] + lVar12 + 0xc0) = auVar29;
    auVar29 = vmovdqu64_avx512f(auVar30);
    *(undefined1 (*) [64])(d->m_huff_code_sizes[0] + lVar12 + 0x80) = auVar29;
    auVar29 = vmovdqu64_avx512f(auVar30);
    *(undefined1 (*) [64])(d->m_huff_code_sizes[0] + lVar12 + 0x40) = auVar29;
    auVar29 = vmovdqu64_avx512f(auVar30);
    *(undefined1 (*) [64])(d->m_huff_code_sizes[0] + lVar12) = auVar29;
    uStack_15f0 = 0x117f6a;
    memset((void *)((long)d->m_huff_codes[0] + local_15e0),0,0x240);
    table_len = local_15e4;
    if (0 < code_size_limit) {
      uVar9 = 1;
      do {
        iVar8 = *(int *)(local_15c8 + uVar9 * 4);
        if (0 < iVar8) {
          puVar19 = puVar21 + (long)(int)uVar18 * 2 + -1;
          uVar18 = uVar18 - iVar8;
          iVar8 = iVar8 + 1;
          do {
            d->m_huff_code_sizes[0][(ulong)*puVar19 + lVar12] = (mz_uint8)uVar9;
            puVar19 = puVar19 + -2;
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != code_size_limit + 1);
    }
  }
  else if (0 < table_len) {
    uVar9 = 0;
    do {
      *(int *)(local_15c8 + (ulong)d->m_huff_code_sizes[local_15d0][uVar9] * 4) =
           *(int *)(local_15c8 + (ulong)d->m_huff_code_sizes[local_15d0][uVar9] * 4) + 1;
      uVar9 = uVar9 + 1;
    } while (uVar26 != uVar9);
  }
  local_1538[1] = 0;
  if (1 < code_size_limit) {
    lVar12 = 0;
    uVar18 = 0;
    do {
      uVar18 = (uVar18 + *(int *)(local_15c8 + lVar12 * 4 + 4)) * 2;
      local_1538[lVar12 + 2] = uVar18;
      lVar12 = lVar12 + 1;
    } while (uVar13 - 1 != lVar12);
  }
  if (0 < table_len) {
    uVar13 = 0;
    do {
      bVar1 = d->m_huff_code_sizes[local_15d0][uVar13];
      if (bVar1 != 0) {
        uVar14 = (uint)bVar1;
        uVar18 = local_1538[uVar14];
        local_1538[uVar14] = uVar18 + 1;
        iVar17 = uVar14 + 1;
        iVar8 = 0;
        do {
          iVar8 = (uVar18 & 1) + iVar8 * 2;
          uVar18 = uVar18 >> 1;
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
        d->m_huff_codes[local_15d0][uVar13] = (mz_uint16)iVar8;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar26);
  }
  return;
}

Assistant:

static void
tdefl_optimize_huffman_table(tdefl_compressor* d, int table_num, int table_len, int code_size_limit, int static_table) {

    int i, j, l, num_codes[1 + TDEFL_MAX_SUPPORTED_HUFF_CODESIZE];
    mz_uint next_code[TDEFL_MAX_SUPPORTED_HUFF_CODESIZE + 1];
    MZ_CLEAR_OBJ(num_codes);
    if (static_table) {
        for (i = 0; i < table_len; i++)
            num_codes[d->m_huff_code_sizes[table_num][i]]++;
    }
    else {
        tdefl_sym_freq syms0[TDEFL_MAX_HUFF_SYMBOLS], syms1[TDEFL_MAX_HUFF_SYMBOLS], * pSyms;
        int num_used_syms = 0;
        const mz_uint16* pSym_count = &d->m_huff_count[table_num][0];
        for (i = 0; i < table_len; i++)
            if (pSym_count[i]) {
                syms0[num_used_syms].m_key = (mz_uint16)pSym_count[i];
                syms0[num_used_syms++].m_sym_index = (mz_uint16)i;
            }

        pSyms = tdefl_radix_sort_syms(num_used_syms, syms0, syms1);
        tdefl_calculate_minimum_redundancy(pSyms, num_used_syms);

        for (i = 0; i < num_used_syms; i++)
            num_codes[pSyms[i].m_key]++;

        tdefl_huffman_enforce_max_code_size(num_codes, num_used_syms, code_size_limit);

        MZ_CLEAR_OBJ(d->m_huff_code_sizes[table_num]);
        MZ_CLEAR_OBJ(d->m_huff_codes[table_num]);
        for (i = 1, j = num_used_syms; i <= code_size_limit; i++)
            for (l = num_codes[i]; l > 0; l--)
                d->m_huff_code_sizes[table_num][pSyms[--j].m_sym_index] = (mz_uint8)(i);
    }

    next_code[1] = 0;
    for (j = 0, i = 2; i <= code_size_limit; i++)
        next_code[i] = j = ((j + num_codes[i - 1]) << 1);

    for (i = 0; i < table_len; i++) {
        mz_uint rev_code = 0, code, code_size;
        if ((code_size = d->m_huff_code_sizes[table_num][i]) == 0)
            continue;
        code = next_code[code_size]++;
        for (l = code_size; l > 0; l--, code >>= 1)
            rev_code = (rev_code << 1) | (code & 1);
        d->m_huff_codes[table_num][i] = (mz_uint16)rev_code;
    }
}